

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_vector.hpp
# Opt level: O3

small_vector<int,_4UL,_0UL,_std::allocator<int>_> * __thiscall
itlib::small_vector<int,_4UL,_0UL,_std::allocator<int>_>::operator=
          (small_vector<int,_4UL,_0UL,_std::allocator<int>_> *this,
          small_vector<int,_4UL,_0UL,_std::allocator<int>_> *v)

{
  int *piVar1;
  int *piVar2;
  int *piVar3;
  size_t sVar4;
  
  if (this != v) {
    this->m_end = this->m_begin;
    piVar2 = choose_data(this,(long)v->m_end - (long)v->m_begin >> 2);
    this->m_end = piVar2;
    this->m_begin = piVar2;
    piVar3 = v->m_begin;
    piVar1 = piVar2;
    if (piVar3 != v->m_end) {
      do {
        *piVar1 = *piVar3;
        this->m_end = piVar1 + 1;
        piVar3 = piVar3 + 1;
        piVar1 = piVar1 + 1;
      } while (piVar3 != v->m_end);
    }
    sVar4 = 4;
    if ((type *)piVar2 != this->m_static_data) {
      sVar4 = this->m_dynamic_capacity;
    }
    this->m_capacity = sVar4;
  }
  return this;
}

Assistant:

small_vector& operator=(const small_vector& v)
    {
        if (this == &v)
        {
            // prevent self usurp
            return *this;
        }

        clear();

        m_begin = m_end = choose_data(v.size());

        for (auto p = v.m_begin; p != v.m_end; ++p)
        {
            atraits::construct(get_alloc(), m_end, *p);
            ++m_end;
        }

        update_capacity();

        return *this;
    }